

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.cpp
# Opt level: O0

bool readFileIntoBuffer(CBString *inPath,UByteArray *buf)

{
  bool bVar1;
  byte bVar2;
  _Ios_Openmode _Var3;
  char *pcVar4;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  istreambuf_iterator<char,_std::char_traits<char>_> __last;
  UByteArray local_298;
  allocator_type local_271;
  undefined1 local_270 [12];
  undefined1 local_260 [12];
  undefined1 local_250 [8];
  vector<char,_std::allocator<char>_> buffer;
  undefined1 local_228 [8];
  ifstream inputFile;
  UByteArray *buf_local;
  CBString *inPath_local;
  
  bVar1 = isExistOnFs(inPath);
  if (bVar1) {
    pcVar4 = Bstrlib::CBString::toLocal8Bit(inPath);
    _Var3 = std::operator|(_S_in,_S_bin);
    std::ifstream::ifstream(local_228,pcVar4,_Var3);
    bVar2 = std::ios::operator!((ios *)(local_228 + (long)*(_func_int **)((long)local_228 + -0x18)))
    ;
    bVar1 = (bVar2 & 1) != 0;
    if (bVar1) {
      buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ = 1;
    }
    else {
      std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
                ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_260,
                 (istream_type *)local_228);
      std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
                ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_270);
      std::allocator<char>::allocator();
      __first._12_4_ = 0;
      __first._M_sbuf = (streambuf_type *)local_260._0_8_;
      __first._M_c = local_260._8_4_;
      __last._12_4_ = 0;
      __last._M_sbuf = (streambuf_type *)local_270._0_8_;
      __last._M_c = local_270._8_4_;
      std::vector<char,std::allocator<char>>::
      vector<std::istreambuf_iterator<char,std::char_traits<char>>,void>
                ((vector<char,std::allocator<char>> *)local_250,__first,__last,&local_271);
      std::allocator<char>::~allocator(&local_271);
      std::ifstream::close();
      UByteArray::UByteArray(&local_298,(vector<char,_std::allocator<char>_> *)local_250);
      UByteArray::operator=(buf,&local_298);
      UByteArray::~UByteArray(&local_298);
      buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ = 1;
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)local_250);
    }
    inPath_local._7_1_ = !bVar1;
    std::ifstream::~ifstream(local_228);
  }
  else {
    inPath_local._7_1_ = false;
  }
  return inPath_local._7_1_;
}

Assistant:

bool readFileIntoBuffer(const UString& inPath, UByteArray& buf) 
{
    if (!isExistOnFs(inPath))
        return false;

    std::ifstream inputFile(inPath.toLocal8Bit(), std::ios::in | std::ios::binary);
    if (!inputFile)
        return false;
    std::vector<char> buffer(std::istreambuf_iterator<char>(inputFile),
        (std::istreambuf_iterator<char>()));
    inputFile.close();

    buf = buffer;

    return true;
}